

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_secp256k1.cpp
# Opt level: O1

void __thiscall
Secp256k1_TweakPrivkeySecp256k1EcErrorTest_Test::~Secp256k1_TweakPrivkeySecp256k1EcErrorTest_Test
          (Secp256k1_TweakPrivkeySecp256k1EcErrorTest_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Secp256k1, TweakPrivkeySecp256k1EcErrorTest) {
  struct secp256k1_context_struct *cxt = wally_get_secp_context();
  Secp256k1 secp = Secp256k1(cxt);
  for (TweakPrivkeyTestVector test_vector : tweak_privkey_error_vectors) {
    if (test_vector.expect_add.empty()) {
      EXPECT_THROW(
        ByteData actual = secp.AddTweakPrivkeySecp256k1Ec(test_vector.privkey,
          test_vector.tweak),
        CfdException);
    }
    if (test_vector.expect_add.empty()) {
      EXPECT_THROW(
        ByteData actual = secp.MulTweakPrivkeySecp256k1Ec(test_vector.privkey,
          test_vector.tweak),
        CfdException);
    }
  }
}